

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor.cpp
# Opt level: O3

void __thiscall duckdb::Executor::CancelTasks(Executor *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  pointer prVar2;
  int iVar3;
  PhysicalRecursiveCTE *pPVar4;
  reference_wrapper<duckdb::PhysicalOperator> *rec_cte_ref;
  pointer prVar5;
  
  p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           (this->task).internal.super___shared_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (this->task).internal.super___shared_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->task).internal.super___shared_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)&this->executor_lock);
  if (iVar3 == 0) {
    this->cancelled = true;
    prVar2 = (this->recursive_ctes).
             super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
             .
             super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (prVar5 = (this->recursive_ctes).
                  super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
                  .
                  super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; prVar5 != prVar2; prVar5 = prVar5 + 1)
    {
      pPVar4 = PhysicalOperator::Cast<duckdb::PhysicalRecursiveCTE>(prVar5->_M_data);
      p_Var1 = (pPVar4->recursive_meta_pipeline).internal.
               super___shared_ptr<duckdb::MetaPipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi;
      (pPVar4->recursive_meta_pipeline).internal.
      super___shared_ptr<duckdb::MetaPipeline,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      (pPVar4->recursive_meta_pipeline).internal.
      super___shared_ptr<duckdb::MetaPipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
      }
    }
    ::std::
    vector<duckdb::shared_ptr<duckdb::Pipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Pipeline,_true>_>_>
    ::clear(&(this->pipelines).
             super_vector<duckdb::shared_ptr<duckdb::Pipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Pipeline,_true>_>_>
           );
    ::std::
    vector<duckdb::shared_ptr<duckdb::Pipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Pipeline,_true>_>_>
    ::clear(&(this->root_pipelines).
             super_vector<duckdb::shared_ptr<duckdb::Pipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Pipeline,_true>_>_>
           );
    ::std::
    _Hashtable<duckdb::Task_*,_std::pair<duckdb::Task_*const,_duckdb::shared_ptr<duckdb::Task,_true>_>,_std::allocator<std::pair<duckdb::Task_*const,_duckdb::shared_ptr<duckdb::Task,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<duckdb::Task_*>,_std::hash<duckdb::Task_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::clear(&(this->to_be_rescheduled_tasks)._M_h);
    ::std::
    vector<duckdb::shared_ptr<duckdb::Event,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Event,_true>_>_>
    ::clear(&(this->events).
             super_vector<duckdb::shared_ptr<duckdb::Event,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Event,_true>_>_>
           );
    pthread_mutex_unlock((pthread_mutex_t *)&this->executor_lock);
    while ((this->executor_tasks).super___atomic_base<unsigned_long>._M_i != 0) {
      WorkOnTasks(this);
    }
    return;
  }
  ::std::__throw_system_error(iVar3);
}

Assistant:

void Executor::CancelTasks() {
	task.reset();

	{
		lock_guard<mutex> elock(executor_lock);
		// mark the query as cancelled so tasks will early-out
		cancelled = true;
		// destroy all pipelines, events and states
		for (auto &rec_cte_ref : recursive_ctes) {
			auto &rec_cte = rec_cte_ref.get().Cast<PhysicalRecursiveCTE>();
			rec_cte.recursive_meta_pipeline.reset();
		}
		pipelines.clear();
		root_pipelines.clear();
		to_be_rescheduled_tasks.clear();
		events.clear();
	}
	// Take all pending tasks and execute them until they cancel
	while (executor_tasks > 0) {
		WorkOnTasks();
	}
}